

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdReplace<wabt::interp::Simd<float,(unsigned_char)4>,float>
          (Thread *this,Instr instr)

{
  Value VVar1;
  Value local_20;
  
  VVar1 = Pop(this);
  local_20 = Pop(this);
  *(u32 *)((long)&local_20 + (ulong)instr.field_2.imm_u8 * 4) = VVar1.i32_;
  Push(this,local_20);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdReplace(Instr instr) {
  auto val = Pop<T>();
  auto simd = Pop<R>();
  simd.v[instr.imm_u8] = val;
  Push(simd);
  return RunResult::Ok;
}